

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O1

RefNode * __thiscall
RefTable::Get(RefTable *this,SQObject *obj,SQHash *mainpos,RefNode **prev,bool add)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectValue SVar3;
  RefNode *pRVar4;
  SQObjectPtr local_38;
  
  local_38.super_SQObject._type = obj->_type;
  local_38.super_SQObject._unVal = (SQObjectValue)(obj->_unVal).pTable;
  if ((local_38.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((local_38.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  if ((int)local_38.super_SQObject._type < 0x5000004) {
    SVar3 = local_38.super_SQObject._unVal;
    if ((local_38.super_SQObject._type != OT_BOOL) && (local_38.super_SQObject._type != OT_INTEGER))
    {
LAB_0012aafb:
      SVar3.nInteger = local_38.super_SQObject._unVal.nInteger >> 3;
    }
  }
  else if (local_38.super_SQObject._type == OT_FLOAT) {
    SVar3.nInteger = (long)local_38.super_SQObject._unVal.fFloat;
  }
  else {
    if (local_38.super_SQObject._type != OT_STRING) goto LAB_0012aafb;
    SVar3 = (SQObjectValue)(local_38.super_SQObject._unVal.pString)->_hash;
  }
  *mainpos = this->_numofslots - 1 & SVar3.nInteger;
  SQObjectPtr::~SQObjectPtr(&local_38);
  *prev = (RefNode *)0x0;
  pRVar4 = this->_buckets[*mainpos];
  if (pRVar4 != (RefNode *)0x0) {
    SVar2 = obj->_type;
    do {
      if (((pRVar4->obj).super_SQObject._unVal.pTable == (obj->_unVal).pTable) &&
         ((pRVar4->obj).super_SQObject._type == SVar2)) {
        return pRVar4;
      }
      *prev = pRVar4;
      pRVar4 = pRVar4->next;
    } while (pRVar4 != (RefNode *)0x0);
  }
  if (!add) {
    return (RefNode *)0x0;
  }
  if (this->_numofslots != this->_slotused) goto LAB_0012abf3;
  Resize(this,this->_numofslots * 2);
  local_38.super_SQObject._type = obj->_type;
  local_38.super_SQObject._unVal = (SQObjectValue)(obj->_unVal).pTable;
  if ((local_38.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((local_38.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  if ((int)local_38.super_SQObject._type < 0x5000004) {
    SVar3 = local_38.super_SQObject._unVal;
    if ((local_38.super_SQObject._type != OT_BOOL) && (local_38.super_SQObject._type != OT_INTEGER))
    {
LAB_0012abcd:
      SVar3.nInteger = local_38.super_SQObject._unVal.nInteger >> 3;
    }
  }
  else if (local_38.super_SQObject._type == OT_FLOAT) {
    SVar3.nInteger = (long)local_38.super_SQObject._unVal.fFloat;
  }
  else {
    if (local_38.super_SQObject._type != OT_STRING) goto LAB_0012abcd;
    SVar3 = (SQObjectValue)(local_38.super_SQObject._unVal.pString)->_hash;
  }
  *mainpos = this->_numofslots - 1 & SVar3.nInteger;
  SQObjectPtr::~SQObjectPtr(&local_38);
LAB_0012abf3:
  pRVar4 = Add(this,*mainpos,obj);
  return pRVar4;
}

Assistant:

RefTable::RefNode *RefTable::Get(SQObject &obj,SQHash &mainpos,RefNode **prev,bool add)
{
    RefNode *ref;
    mainpos = ::HashObj(obj)&(_numofslots-1);
    *prev = NULL;
    for (ref = _buckets[mainpos]; ref; ) {
        if(_rawval(ref->obj) == _rawval(obj) && type(ref->obj) == type(obj))
            break;
        *prev = ref;
        ref = ref->next;
    }
    if(ref == NULL && add) {
        if(_numofslots == _slotused) {
            assert(_freelist == 0);
            Resize(_numofslots*2);
            mainpos = ::HashObj(obj)&(_numofslots-1);
        }
        ref = Add(mainpos,obj);
    }
    return ref;
}